

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validity_mask.hpp
# Opt level: O1

void __thiscall
duckdb::RLEState<unsigned_int>::Update<duckdb::EmptyRLEWriter>
          (RLEState<unsigned_int> *this,uint *data,ValidityMask *validity,idx_t idx)

{
  uint uVar1;
  unsigned_long *puVar2;
  
  puVar2 = (validity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  if ((puVar2 == (unsigned_long *)0x0) || ((puVar2[idx >> 6] >> (idx & 0x3f) & 1) != 0)) {
    if (this->all_null == true) {
      this->last_value = data[idx];
      this->seen_count = this->seen_count + 1;
      this->last_seen_count = this->last_seen_count + 1;
      this->all_null = false;
    }
    else {
      uVar1 = data[idx];
      if (this->last_value == uVar1) {
        this->last_seen_count = this->last_seen_count + 1;
      }
      else {
        if (this->last_seen_count != 0) {
          this->seen_count = this->seen_count + 1;
        }
        this->last_value = uVar1;
        this->last_seen_count = 1;
      }
    }
  }
  else {
    this->last_seen_count = this->last_seen_count + 1;
  }
  if (this->last_seen_count != 0xffff) {
    return;
  }
  this->last_seen_count = 0;
  this->seen_count = this->seen_count + 1;
  return;
}

Assistant:

inline bool RowIsValid(idx_t row_idx) const {
#ifdef DEBUG
		if (row_idx >= capacity) {
			throw InternalException("ValidityMask::RowIsValid - row_idx %d is out-of-range for mask with capacity %llu",
			                        row_idx, capacity);
		}
#endif
		if (!validity_mask) {
			return true;
		}
		return RowIsValidUnsafe(row_idx);
	}